

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge.cpp
# Opt level: O0

void ge_madd(ge_p1p1 *r,ge_p3 *p,ge_precomp *q)

{
  i32 local_48 [2];
  fe t0;
  ge_precomp *q_local;
  ge_p3 *p_local;
  ge_p1p1 *r_local;
  
  t0._32_8_ = q;
  fe_add(r->X,p->Y,p->X);
  fe_sub(r->Y,p->Y,p->X);
  fe_mul(r->Z,r->X,(i32 *)t0._32_8_);
  fe_mul(r->Y,r->Y,(i32 *)(t0._32_8_ + 0x28));
  fe_mul(r->T,(i32 *)(t0._32_8_ + 0x50),p->T);
  fe_add(local_48,p->Z,p->Z);
  fe_sub(r->X,r->Z,r->Y);
  fe_add(r->Y,r->Z,r->Y);
  fe_add(r->Z,local_48,r->T);
  fe_sub(r->T,local_48,r->T);
  return;
}

Assistant:

void ge_madd(ge_p1p1 *r, const ge_p3 *p, const ge_precomp *q) {
    fe t0;
    fe_add(r->X, p->Y, p->X);
    fe_sub(r->Y, p->Y, p->X);
    fe_mul(r->Z, r->X, q->yplusx);
    fe_mul(r->Y, r->Y, q->yminusx);
    fe_mul(r->T, q->xy2d, p->T);
    fe_add(t0, p->Z, p->Z);
    fe_sub(r->X, r->Z, r->Y);
    fe_add(r->Y, r->Z, r->Y);
    fe_add(r->Z, t0, r->T);
    fe_sub(r->T, t0, r->T);
}